

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O1

void ImGuiStb::stb_textedit_delete_selection(ImGuiInputTextState *str,STB_TexteditState *state)

{
  int iVar1;
  int where;
  int *piVar2;
  int *piVar3;
  
  stb_textedit_clamp(str,state);
  piVar3 = &state->select_start;
  iVar1 = state->select_start;
  where = state->select_end;
  if (iVar1 - where != 0) {
    if (iVar1 < where) {
      stb_textedit_delete(str,state,iVar1,where - iVar1);
      piVar2 = piVar3;
      piVar3 = &state->select_end;
    }
    else {
      stb_textedit_delete(str,state,where,iVar1 - where);
      piVar2 = &state->select_end;
    }
    iVar1 = *piVar2;
    state->cursor = iVar1;
    *piVar3 = iVar1;
    state->has_preferred_x = '\0';
  }
  return;
}

Assistant:

static void stb_textedit_delete_selection(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   stb_textedit_clamp(str, state);
   if (STB_TEXT_HAS_SELECTION(state)) {
      if (state->select_start < state->select_end) {
         stb_textedit_delete(str, state, state->select_start, state->select_end - state->select_start);
         state->select_end = state->cursor = state->select_start;
      } else {
         stb_textedit_delete(str, state, state->select_end, state->select_start - state->select_end);
         state->select_start = state->cursor = state->select_end;
      }
      state->has_preferred_x = 0;
   }
}